

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O1

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
          (Call *this,shared_ptr<mocker::ir::Reg> *dest,string *funcName,
          shared_ptr<mocker::ir::Addr> *args,shared_ptr<mocker::ir::Addr> *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  long lVar7;
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  undefined8 uStack_48;
  shared_ptr<mocker::ir::Addr> local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__IRInst_001efbe0;
  (this->super_IRInst).type = Call;
  peVar4 = (dest->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var5 = (dest->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (dest->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (dest->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_001f0858;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_001f0878;
  paVar1 = &(this->funcName).field_2;
  (this->funcName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (funcName->_M_dataplus)._M_p;
  paVar2 = &funcName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&funcName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->funcName).field_2 + 8) = uVar6;
  }
  else {
    (this->funcName)._M_dataplus._M_p = pcVar3;
    (this->funcName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->funcName)._M_string_length = funcName->_M_string_length;
  (funcName->_M_dataplus)._M_p = (pointer)paVar2;
  funcName->_M_string_length = 0;
  (funcName->field_2)._M_local_buf[0] = '\0';
  local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_30 = (args_1->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (args_1->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  (args_1->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args_1->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  __l._M_len = 2;
  __l._M_array = &local_40;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,(allocator_type *)((long)&uStack_48 + 7));
  lVar7 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_48 + lVar7) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_48 + lVar7));
    }
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != 0);
  return;
}

Assistant:

Call(std::shared_ptr<Reg> dest, std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(std::move(dest)),
        funcName(std::move(funcName)), args({std::move(args)...}) {}